

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_zone.hpp
# Opt level: O2

void * __thiscall msgpack::v1::zone::allocate_align(zone *this,size_t size,size_t align)

{
  void *pvVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (this->m_chunk_list).m_free;
  pcVar2 = (this->m_chunk_list).m_ptr;
  pvVar1 = (void *)((ulong)(pcVar2 + (align - 1)) & -align);
  uVar4 = (long)pvVar1 + (size - (long)pcVar2);
  if (uVar3 < uVar4) {
    pcVar2 = allocate_expand(this,(size + align) - 1);
    pvVar1 = (void *)((ulong)(pcVar2 + (align - 1)) & -align);
    uVar3 = (this->m_chunk_list).m_free;
    pcVar2 = (this->m_chunk_list).m_ptr;
    uVar4 = (size - (long)pcVar2) + (long)pvVar1;
  }
  (this->m_chunk_list).m_free = uVar3 - uVar4;
  (this->m_chunk_list).m_ptr = pcVar2 + uVar4;
  return pvVar1;
}

Assistant:

inline void* zone::allocate_align(size_t size, size_t align)
{
    char* aligned = get_aligned(m_chunk_list.m_ptr, align);
    size_t adjusted_size = size + static_cast<size_t>(aligned - m_chunk_list.m_ptr);
    if (m_chunk_list.m_free < adjusted_size) {
        size_t enough_size = size + align - 1;
        char* ptr = allocate_expand(enough_size);
        aligned = get_aligned(ptr, align);
        adjusted_size = size + static_cast<size_t>(aligned - m_chunk_list.m_ptr);
    }
    m_chunk_list.m_free -= adjusted_size;
    m_chunk_list.m_ptr  += adjusted_size;
    return aligned;
}